

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O2

void __thiscall
roaring::RoaringSetBitBiDirectionalIterator::RoaringSetBitBiDirectionalIterator
          (RoaringSetBitBiDirectionalIterator *this,Roaring *parent,bool exhausted)

{
  undefined3 in_register_00000011;
  
  (this->i).parent = (roaring_bitmap_t *)0x0;
  (this->i).container = (container_s *)0x0;
  (this->i).typecode = '\0';
  (this->i).container_index = 0;
  (this->i).highbits = 0;
  (this->i).container_it = 0;
  (this->i).current_value = 0;
  (this->i).has_value = false;
  if (CONCAT31(in_register_00000011,exhausted) != 0) {
    (this->i).parent = &parent->roaring;
    (this->i).container_index = 0x7fffffff;
    (this->i).has_value = false;
    (this->i).current_value = 0xffffffff;
    return;
  }
  roaring_iterator_init((roaring_bitmap_t *)parent,(roaring_uint32_iterator_t *)this);
  return;
}

Assistant:

explicit RoaringSetBitBiDirectionalIterator(const Roaring &parent,
                                                bool exhausted = false) {
        if (exhausted) {
            i.parent = &parent.roaring;
            i.container_index = INT32_MAX;
            i.has_value = false;
            i.current_value = UINT32_MAX;
        } else {
            api::roaring_iterator_init(&parent.roaring, &i);
        }
    }